

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.hh
# Opt level: O1

void __thiscall Pl_Base64::~Pl_Base64(Pl_Base64 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002edaa0;
  pcVar2 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar1 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

~Pl_Base64() final = default;